

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

Group * __thiscall r_exec::Group::get_secondary_group(Group *this)

{
  Code *pCVar1;
  bool bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  Code **ppCVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  Group *pGVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  iterator local_48;
  iterator local_38;
  undefined1 local_28 [8];
  const_iterator m;
  Group *secondary;
  Group *this_local;
  
  m._list = (list<r_code::Code_*> *)0x0;
  r_code::list<r_code::Code_*>::const_iterator::const_iterator((const_iterator *)local_28);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x13])();
  local_38 = r_code::list<r_code::Code_*>::begin
                       (&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                         super_LObject.super_Code.markers);
  r_code::list<r_code::Code_*>::const_iterator::operator=((const_iterator *)local_28,&local_38);
  do {
    local_48 = r_code::list<r_code::Code_*>::end
                         (&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                           super_LObject.super_Code.markers);
    bVar2 = r_code::list<r_code::Code_*>::_iterator::operator!=
                      ((_iterator *)local_28,&local_48.super__iterator);
    if (!bVar2) {
LAB_00238b2f:
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[0x14])();
      return (Group *)m._list;
    }
    ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_28);
    (*((*ppCVar6)->super__Object)._vptr__Object[4])(*ppCVar6,0);
    sVar3 = r_code::Atom::asOpcode();
    uVar7 = 0;
    if (sVar3 == Opcodes::MkGrpPair) {
      ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_28);
      pCVar1 = *ppCVar6;
      ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*((const_iterator *)local_28);
      (*((*ppCVar6)->super__Object)._vptr__Object[4])(*ppCVar6,1);
      uVar4 = r_code::Atom::asIndex();
      iVar5 = (*(pCVar1->super__Object)._vptr__Object[9])
                        (pCVar1,(ulong)uVar4,extraout_RDX,
                         CONCAT62((int6)((ulong)uVar7 >> 0x10),uVar4));
      if ((Group *)CONCAT44(extraout_var,iVar5) == this) {
        pGVar8 = this;
        ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*
                            ((const_iterator *)local_28);
        pCVar1 = *ppCVar6;
        ppCVar6 = r_code::list<r_code::Code_*>::const_iterator::operator*
                            ((const_iterator *)local_28);
        (*((*ppCVar6)->super__Object)._vptr__Object[4])(*ppCVar6,2);
        uVar4 = r_code::Atom::asIndex();
        iVar5 = (*(pCVar1->super__Object)._vptr__Object[9])
                          (pCVar1,(ulong)uVar4,extraout_RDX_00,
                           CONCAT62((int6)((ulong)pGVar8 >> 0x10),uVar4));
        m._list = (list<r_code::Code_*> *)CONCAT44(extraout_var_00,iVar5);
        goto LAB_00238b2f;
      }
    }
    r_code::list<r_code::Code_*>::const_iterator::operator++((const_iterator *)local_28);
  } while( true );
}

Assistant:

Group *Group::get_secondary_group()
{
    Group *secondary = nullptr;
    r_code::list<Code *>::const_iterator m;
    acq_markers();

    for (m = markers.begin(); m != markers.end(); ++m) {
        if ((*m)->code(0).asOpcode() == Opcodes::MkGrpPair) {
            if ((Group *)(*m)->get_reference((*m)->code(GRP_PAIR_FIRST).asIndex()) == this) {
                secondary = (Group *)(*m)->get_reference((*m)->code(GRP_PAIR_SECOND).asIndex());
                break;
            }
        }
    }

    rel_markers();
    return secondary;
}